

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O3

bool __thiscall Clasp::Solver::propagateFrom(Solver *this,PostPropagator *p)

{
  int iVar1;
  PostPropagator *pPVar2;
  PostPropagator **r;
  PostPropagator **ppPVar3;
  PostPropagator *pPVar4;
  
  ppPVar3 = this->postHead_;
  pPVar2 = *ppPVar3;
  if (pPVar2 != (PostPropagator *)0x0) {
    if (pPVar2 != p) {
      do {
        pPVar4 = pPVar2;
        pPVar2 = pPVar4->next;
        if (pPVar2 == (PostPropagator *)0x0) {
          return true;
        }
      } while (pPVar2 != p);
      ppPVar3 = &pPVar4->next;
    }
    do {
      iVar1 = (*(pPVar2->super_Constraint)._vptr_Constraint[0x14])(pPVar2,this,0);
      if ((char)iVar1 == '\0') {
        (this->assign_).front = (this->assign_).trail.ebo_.size;
        for (pPVar2 = *this->postHead_; pPVar2 != (PostPropagator *)0x0; pPVar2 = pPVar2->next) {
          (*(pPVar2->super_Constraint)._vptr_Constraint[0x15])(pPVar2);
        }
        return false;
      }
      if (pPVar2 == *ppPVar3) {
        ppPVar3 = &pPVar2->next;
      }
      pPVar2 = *ppPVar3;
    } while (pPVar2 != (PostPropagator *)0x0);
  }
  return true;
}

Assistant:

bool Solver::propagateFrom(PostPropagator* p) {
	assert((p && *postHead_) && "OP not allowed during init!");
	assert(queueSize() == 0);
	for (PostPropagator** r = postHead_; *r;) {
		if      (*r != p)             { r = &(*r)->next; }
		else if (postPropagate(r, 0)) { break; }
		else {
			cancelPropagation();
			return false;
		}
	}
	assert(queueSize() == 0);
	return true;
}